

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_StringUtilities.h
# Opt level: O0

string * choc::text::createHexString<unsigned_char>
                   (string *__return_storage_ptr__,uchar v,int minNumDigits)

{
  char *__end;
  char *__beg;
  allocator<char> local_59;
  char *local_58;
  char *d;
  char *end;
  char hex [40];
  int local_18;
  type value;
  int minNumDigits_local;
  uchar v_local;
  
  hex[0x27] = v;
  soul::checkAssertion(minNumDigits < 0x21,"minNumDigits <= 32","createHexString",0x9e);
  __end = hex + 0x1f;
  hex[0x1f] = '\0';
  local_58 = __end;
  local_18 = minNumDigits;
  do {
    do {
      __beg = local_58 + -1;
      local_58[-1] = "0123456789abcdef"[(byte)hex[0x27] & 0xf];
      hex[0x27] = (char)((int)(uint)(byte)hex[0x27] >> 4);
      local_18 = local_18 + -1;
      local_58 = __beg;
    } while (hex[0x27] != '\0');
  } while (0 < local_18);
  d = __end;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>((string *)__return_storage_ptr__,__beg,__end,&local_59);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::string createHexString (IntegerType v, int minNumDigits)
{
    static_assert (std::is_integral<IntegerType>::value, "Need to pass integers into this method");
    auto value = static_cast<typename std::make_unsigned<IntegerType>::type> (v);
    CHOC_ASSERT (minNumDigits <= 32);

    char hex[40];
    const auto end = hex + sizeof (hex) - 1;
    auto d = end;
    *d = 0;

    for (;;)
    {
        *--d = "0123456789abcdef"[static_cast<uint32_t> (value) & 15u];
        value = static_cast<decltype (value)> (value >> 4);
        --minNumDigits;

        if (value == 0 && minNumDigits <= 0)
            return std::string (d, end);
    }
}